

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool check_alignment<test_ctx<64ul>>(void)

{
  void *pvVar1;
  size_t addr;
  void *ptr;
  size_t alignment;
  test_ctx<64UL> ctx;
  
  test_ctx<64UL>::test_ctx((test_ctx<64UL> *)&alignment,0x1000);
  printf("    alignment: %ld\n",0x40);
  pvVar1 = test_ctx<64UL>::alloc((test_ctx<64UL> *)&alignment,0x40);
  test_ctx<64UL>::~test_ctx((test_ctx<64UL> *)&alignment);
  return ((ulong)pvVar1 & 0x3f) == 0;
}

Assistant:

static bool check_alignment()
{
    CTX ctx(PAGE_SIZE);
    const size_t alignment {ctx.heap.alignment()};
    TRACE("alignment: %ld", alignment);

    void *ptr = ctx.alloc(alignment);
    size_t addr = reinterpret_cast<size_t>(ptr);

    return ((addr & (alignment - 1)) == 0);
}